

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::fix_up_interface_member_indices
          (CompilerMSL *this,StorageClass storage,uint32_t ib_type_id)

{
  bool bVar1;
  bool bVar2;
  ExecutionModel EVar3;
  uint32_t id;
  mapped_type *pmVar4;
  size_t sVar5;
  SPIRVariable *var_00;
  SPIRType *pSVar6;
  uint32_t local_44;
  uint32_t mbr_idx;
  bool is_block;
  bool flatten_composites;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t var_id;
  uint32_t i;
  uint32_t local_18;
  uint32_t mbr_cnt;
  uint32_t ib_type_id_local;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  local_18 = ib_type_id;
  mbr_cnt = storage;
  _ib_type_id_local = this;
  bVar1 = is_tesc_shader(this);
  if (((bVar1) || ((bVar1 = is_tese_shader(this), bVar1 && (mbr_cnt == 1)))) ||
     ((EVar3 = Compiler::get_execution_model((Compiler *)this), EVar3 == ExecutionModelFragment &&
      ((mbr_cnt == 1 &&
       (bVar1 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::empty(&this->pull_model_inputs), !bVar1)))))) {
    TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)&var_id,local_18);
    pmVar4 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,(key_type *)&var_id);
    sVar5 = VectorView<spirv_cross::Meta::Decoration>::size
                      (&(pmVar4->members).super_VectorView<spirv_cross::Meta::Decoration>);
    i = (uint32_t)sVar5;
    for (var._4_4_ = 0; var._4_4_ < i; var._4_4_ = var._4_4_ + 1) {
      id = Compiler::get_extended_member_decoration
                     ((Compiler *)this,local_18,var._4_4_,SPIRVCrossDecorationInterfaceOrigID);
      if (id != 0) {
        var_00 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,id);
        pSVar6 = Compiler::get_variable_element_type((Compiler *)this,var_00);
        bVar1 = variable_storage_requires_stage_io(this,var_00->storage);
        bVar2 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
        local_44 = 0xffffffff;
        if ((pSVar6->basetype == Struct) && ((bVar1 || (bVar2)))) {
          local_44 = Compiler::get_extended_member_decoration
                               ((Compiler *)this,local_18,var._4_4_,
                                SPIRVCrossDecorationInterfaceMemberIndex);
        }
        if (local_44 == 0xffffffff) {
          bVar1 = Compiler::has_extended_decoration
                            ((Compiler *)this,id,SPIRVCrossDecorationInterfaceMemberIndex);
          if (!bVar1) {
            Compiler::set_extended_decoration
                      ((Compiler *)this,id,SPIRVCrossDecorationInterfaceMemberIndex,var._4_4_);
          }
        }
        else {
          bVar1 = Compiler::has_extended_member_decoration
                            ((Compiler *)this,id,local_44,SPIRVCrossDecorationInterfaceMemberIndex);
          if (!bVar1) {
            Compiler::set_extended_member_decoration
                      ((Compiler *)this,id,local_44,SPIRVCrossDecorationInterfaceMemberIndex,
                       var._4_4_);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::fix_up_interface_member_indices(StorageClass storage, uint32_t ib_type_id)
{
	// Only needed for tessellation shaders and pull-model interpolants.
	// Need to redirect interface indices back to variables themselves.
	// For structs, each member of the struct need a separate instance.
	if (!is_tesc_shader() && !(is_tese_shader() && storage == StorageClassInput) &&
	    !(get_execution_model() == ExecutionModelFragment && storage == StorageClassInput &&
	      !pull_model_inputs.empty()))
		return;

	auto mbr_cnt = uint32_t(ir.meta[ib_type_id].members.size());
	for (uint32_t i = 0; i < mbr_cnt; i++)
	{
		uint32_t var_id = get_extended_member_decoration(ib_type_id, i, SPIRVCrossDecorationInterfaceOrigID);
		if (!var_id)
			continue;
		auto &var = get<SPIRVariable>(var_id);

		auto &type = get_variable_element_type(var);

		bool flatten_composites = variable_storage_requires_stage_io(var.storage);
		bool is_block = has_decoration(type.self, DecorationBlock);

		uint32_t mbr_idx = uint32_t(-1);
		if (type.basetype == SPIRType::Struct && (flatten_composites || is_block))
			mbr_idx = get_extended_member_decoration(ib_type_id, i, SPIRVCrossDecorationInterfaceMemberIndex);

		if (mbr_idx != uint32_t(-1))
		{
			// Only set the lowest InterfaceMemberIndex for each variable member.
			// IB struct members will be emitted in-order w.r.t. interface member index.
			if (!has_extended_member_decoration(var_id, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex))
				set_extended_member_decoration(var_id, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, i);
		}
		else
		{
			// Only set the lowest InterfaceMemberIndex for each variable.
			// IB struct members will be emitted in-order w.r.t. interface member index.
			if (!has_extended_decoration(var_id, SPIRVCrossDecorationInterfaceMemberIndex))
				set_extended_decoration(var_id, SPIRVCrossDecorationInterfaceMemberIndex, i);
		}
	}
}